

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_objects.cxx
# Opt level: O0

void __thiscall
xray_re::xr_custom_object::xr_custom_object
          (xr_custom_object *this,xr_scene *scene,tools_class_id class_id)

{
  tools_class_id class_id_local;
  xr_scene *scene_local;
  xr_custom_object *this_local;
  
  this->_vptr_xr_custom_object = (_func_int **)&PTR__xr_custom_object_0038db70;
  this->m_scene = scene;
  this->m_class_id = class_id;
  this->m_flags = 2;
  std::__cxx11::string::string((string *)&this->m_name);
  this->m_motion = (xr_obj_motion *)0x0;
  this->m_time = 0.0;
  _vector3<float>::set(&this->m_position,0.0,0.0,0.0);
  _vector3<float>::set(&this->m_rotation,0.0,0.0,0.0);
  _vector3<float>::set(&this->m_scale,1.0,1.0,1.0);
  return;
}

Assistant:

xr_custom_object::xr_custom_object(xr_scene& scene, tools_class_id class_id):
	m_scene(scene), m_class_id(class_id),
	m_flags(COF_VISIBLE), m_motion(0), m_time(0)
{
	m_position.set();
	m_rotation.set();
	m_scale.set(1.f, 1.f, 1.f);
}